

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_AllHonors_TestShell::
~TEST_DoublingFactorCounterTest_AllHonors_TestShell
          (TEST_DoublingFactorCounterTest_AllHonors_TestShell *this)

{
  TEST_DoublingFactorCounterTest_AllHonors_TestShell *mem;
  TEST_DoublingFactorCounterTest_AllHonors_TestShell *this_local;
  
  mem = this;
  ~TEST_DoublingFactorCounterTest_AllHonors_TestShell(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, AllHonors)
{
	addPair(Tile::EastWind);
	addTriplet(Tile::SouthWind, false);
	addTriplet(Tile::WestWind, false);
	addTriplet(Tile::WhiteDragon, false);
	addTriplet(Tile::GreenDragon, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::AllHonors));
	CHECK_EQUAL(100, r.doubling_factor);
}